

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateBuilderMembers(RepeatedImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Options *pOVar3;
  Semantic local_414;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_410;
  string_view local_408;
  string_view local_3f8;
  string_view local_3e8;
  Options local_3d8;
  Semantic local_384;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_380;
  string_view local_378;
  string_view local_368;
  string_view local_358;
  Options local_348;
  Semantic local_2f4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2f0;
  string_view local_2e8;
  string_view local_2d8;
  string_view local_2c8;
  Options local_2b8;
  Semantic local_264;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_260;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  Options local_228;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  Options local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  Options local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldLiteGenerator *this_local;
  
  pFVar1 = this->descriptor_;
  local_18 = printer;
  printer_local = (Printer *)this;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_68,pOVar3);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_68,false,false,false);
  Options::~Options(&local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "@java.lang.Override\n$deprecation$public java.util.List<$boxed_type$>\n    ${$get$capitalized_name$List$}$() {\n  return java.util.Collections.unmodifiableList(\n      instance.get$capitalized_name$List());\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_88[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_98,local_a8,pFVar1,local_b0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_108,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_108,false,false,false);
  Options::~Options(&local_108);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return instance.get$capitalized_name$Count();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_128,local_138,pFVar1,local_140);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_198,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_198,false,false,false);
  Options::~Options(&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return instance.get$capitalized_name$(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1b8,local_1c8,pFVar1,local_1d0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_228,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_228,true,false,false);
  Options::~Options(&local_228);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, $type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_238);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"}");
  pFVar1 = this->descriptor_;
  local_264 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_260,&local_264);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_248,local_258,pFVar1,local_260);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_2b8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_2b8,true,false,false);
  Options::~Options(&local_2b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,
             "$deprecation$public Builder ${$add$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_2c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"}");
  pFVar1 = this->descriptor_;
  local_2f4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_2f0,&local_2f4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2d8,local_2e8,pFVar1,local_2f0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_348,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_MULTI_ADDER,&local_348,true,false,false);
  Options::~Options(&local_348);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_358,
             "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<? extends $boxed_type$> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$(values);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_358);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_368,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_378,"}");
  pFVar1 = this->descriptor_;
  local_384 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_380,&local_384);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_368,local_378,pFVar1,local_380);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_3d8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_3d8,true,false,false);
  Options::~Options(&local_3d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3e8,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_3e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,"}");
  pFVar1 = this->descriptor_;
  local_414 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_410,&local_414);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_3f8,local_408,pFVar1,local_410);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  return java.util.Collections.unmodifiableList(\n"
                 "      instance.get$capitalized_name$List());\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return instance.get$capitalized_name$Count();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return instance.get$capitalized_name$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, $type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(index, value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$add$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.add$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<? extends $boxed_type$> values) {\n"
                 "  copyOnWrite();\n"
                 "  instance.addAll$capitalized_name$(values);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}